

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QString,_ProString>::convertTo<QString>
          (QString *__return_storage_ptr__,QStringBuilder<QString,_ProString> *this)

{
  int iVar1;
  long lVar2;
  char16_t *__dest;
  CutResult CVar3;
  char16_t *pcVar4;
  char16_t *__src;
  long lVar5;
  long in_FS_OFFSET;
  long local_40;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->b).m_string.d.ptr == (char16_t *)0x0 && (this->a).d.ptr == (char16_t *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_00246eb7:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    iVar1 = (this->b).m_length;
    lVar2 = (this->a).d.size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,iVar1 + lVar2,Uninitialized);
    __dest = (__return_storage_ptr__->d).ptr;
    lVar2 = (this->a).d.size;
    if (lVar2 != 0) {
      pcVar4 = (this->a).d.ptr;
      if (pcVar4 == (char16_t *)0x0) {
        pcVar4 = (char16_t *)&QString::_empty;
      }
      memcpy(__dest,pcVar4,lVar2 * 2);
    }
    lVar5 = (long)(this->b).m_length;
    if (lVar5 != 0) {
      pcVar4 = (this->b).m_string.d.ptr;
      local_38 = (long)(this->b).m_offset;
      local_40 = lVar5;
      CVar3 = QtPrivate::QContainerImplHelper::mid((this->b).m_string.d.size,&local_38,&local_40);
      __src = (char16_t *)0x0;
      if (CVar3 != Null) {
        __src = pcVar4 + local_38;
      }
      memcpy(__dest + lVar2,__src,lVar5 * 2);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_00246eb7;
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }